

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfTcpConnection.c
# Opt level: O0

sbfError sbfTcpConnection_accept
                   (sbfTcpConnection_conflict tc,sbfMwThread_conflict thread,sbfQueue queue,
                   sbfTcpConnectionReadyCb readyCb,sbfTcpConnectionErrorCb errorCb,
                   sbfTcpConnectionReadCb readCb,void *closure)

{
  sbfError __errnum;
  char *pcVar1;
  void *in_RCX;
  undefined8 *in_RDI;
  sbfTcpConnectionErrorCb in_stack_00000008;
  sbfError error;
  sbfTcpConnectionReadyCb in_stack_ffffffffffffffb0;
  sbfQueue in_stack_ffffffffffffffb8;
  undefined8 uVar2;
  sbfMwThread_conflict in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  
  sbfLog_log(*in_RDI,0,"accepting TCP connection %p %s ready",in_RDI,(long)in_RDI + 0x22);
  __errnum = sbfTcpConnectionSet((sbfTcpConnection_conflict)
                                 CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                                 in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                                 in_stack_ffffffffffffffb0,in_stack_00000008,
                                 (sbfTcpConnectionReadCb)0x10296d,in_RCX);
  if (__errnum == 0) {
    bufferevent_enable(in_RDI[2],6);
  }
  else {
    uVar2 = *in_RDI;
    pcVar1 = strerror(__errnum);
    sbfLog_log(uVar2,3,"error accepting TCP connection %p: %s",in_RDI,pcVar1);
  }
  return __errnum;
}

Assistant:

sbfError
sbfTcpConnection_accept (sbfTcpConnection tc,
                         sbfMwThread thread,
                         sbfQueue queue,
                         sbfTcpConnectionReadyCb readyCb,
                         sbfTcpConnectionErrorCb errorCb,
                         sbfTcpConnectionReadCb readCb,
                         void* closure)
{
    sbfError error;

#ifndef WIN32
        sbfLog_debug (tc->mLog,
                      "accepting TCP connection %p %s ready",
                      tc,
                      tc->mPeer.sun.sun_path);
#else
        char     tmp[INET_ADDRSTRLEN];
        inet_ntop (AF_INET, &tc->mPeer.sin.sin_addr, tmp, sizeof tmp);
        sbfLog_debug (tc->mLog,
                      "accepting TCP connection %p from %s:%hu",
                      tc,
                      tmp,
                      ntohs (tc->mPeer.sin.sin_port));
#endif
    
    error = sbfTcpConnectionSet (tc,
                                  thread,
                                  queue,
                                  readyCb,
                                  errorCb,
                                  readCb,
                                  closure);
    if (error == 0)
        bufferevent_enable (tc->mEvent, EV_READ|EV_WRITE);
    else
    {
        sbfLog_err (tc->mLog,
                    "error accepting TCP connection %p: %s",
                    tc,
                    strerror (error));
    }
    return error;
}